

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O0

uint32_t asmjit::v1_14::x86::kmovInstFromSize(uint32_t size)

{
  uint32_t size_local;
  uint32_t local_4;
  
  switch(size) {
  case 1:
    local_4 = 0x165;
    break;
  case 2:
    local_4 = 0x168;
    break;
  default:
    local_4 = 0;
    break;
  case 4:
    local_4 = 0x166;
    break;
  case 8:
    local_4 = 0x167;
  }
  return local_4;
}

Assistant:

static inline uint32_t kmovInstFromSize(uint32_t size) noexcept {
  switch (size) {
    case  1: return Inst::kIdKmovb;
    case  2: return Inst::kIdKmovw;
    case  4: return Inst::kIdKmovd;
    case  8: return Inst::kIdKmovq;
    default: return Inst::kIdNone;
  }
}